

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O3

bool crnlib::create_compressed_texture
               (crn_comp_params *params,vector<unsigned_char> *comp_data,
               uint32 *pActual_quality_level,float *pActual_bitrate)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  itexture_comp *p;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined4 extraout_var_00;
  uint uVar10;
  uint uVar11;
  uint32 uVar12;
  ulong uVar14;
  ulong uVar15;
  char *p_00;
  byte bVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  float bitrate;
  crn_comp_params local_params;
  float cached_bitrates [256];
  uint32 local_7f4;
  float local_7f0;
  float local_7ec;
  undefined1 local_7e8 [16];
  crn_comp_params *local_7d0;
  float *local_7c8;
  uint32 *local_7c0;
  vector<unsigned_char> *local_7b8;
  undefined1 local_7b0 [4];
  crn_file_type local_7ac;
  long local_798;
  uint local_790;
  float local_488;
  uint local_484;
  float afStack_438 [258];
  undefined4 extraout_var;
  ulong uVar13;
  
  local_7d0 = params;
  memcpy(local_7b0,params,0x378);
  if ((local_798 - 3U < 7) && ((local_790 & 1) != 0)) {
    console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
    local_790 = local_790 & 0xfffffffe;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (comp_data->m_size != 0) {
    comp_data->m_size = 0;
  }
  p = create_texture_comp(local_7ac);
  if (p == (itexture_comp *)0x0) {
    return false;
  }
  iVar5 = (*p->_vptr_itexture_comp[3])(p,local_7b0);
  if ((char)iVar5 == '\0') {
LAB_00166f49:
    (**p->_vptr_itexture_comp)(p);
    goto LAB_00166f52;
  }
  if (local_798 != 1 && 0.0 < local_488) {
    if ((local_7ac != cCRNFileTypeCRN) || ((local_790 & 0x40) == 0)) {
      local_7e8 = ZEXT816(0x501502f9);
      local_7f4 = 0xffffffff;
      local_7c8 = pActual_bitrate;
      local_7c0 = pActual_quality_level;
      local_7b8 = comp_data;
      do {
        lVar7 = 0;
        do {
          afStack_438[lVar7] = -1.0;
          afStack_438[lVar7 + 1] = -1.0;
          afStack_438[lVar7 + 2] = -1.0;
          afStack_438[lVar7 + 3] = -1.0;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x100);
        uVar18 = 0xff;
        local_7ec = 0.0;
        bVar16 = 0;
        uVar19 = 0;
        uVar15 = 0;
        do {
          iVar5 = (int)uVar15;
          iVar17 = (int)uVar18;
          if ((int)local_7d0->m_flags < 0) {
            console::debug("Quality level bracket: [%u, %u]",uVar15,uVar18);
          }
          uVar11 = (iVar17 + iVar5) / 2;
          uVar13 = (ulong)uVar11;
          uVar14 = uVar13;
          if (!(bool)(uVar19 == 0 | bVar16)) {
            lVar8 = (long)(int)uVar11;
            lVar7 = lVar8;
            do {
              fVar1 = afStack_438[lVar7];
              if (lVar7 < 1) break;
              lVar7 = lVar7 + -1;
            } while (fVar1 < 0.0);
            if (0.0 <= fVar1) {
              if (iVar17 + iVar5 < 0x1fe) {
                do {
                  fVar2 = afStack_438[lVar8 + 1];
                  if (0xfd < lVar8) break;
                  lVar8 = lVar8 + 1;
                } while (fVar2 < 0.0);
                if ((((0.0 <= fVar2) && (fVar1 < fVar2)) && (fVar1 < local_488)) &&
                   (local_488 <= fVar2)) {
                  iVar6 = (int)(((float)(iVar17 - iVar5) * (local_488 - fVar1)) / (fVar2 - fVar1));
                  uVar10 = iVar6 + iVar5;
                  if (iVar17 < (int)uVar10) {
                    uVar10 = uVar11;
                  }
                  uVar14 = (ulong)uVar10;
                  if (iVar6 < 0) {
                    uVar14 = uVar13;
                  }
                }
              }
            }
            else {
              uVar14 = (ulong)(uint)(int)(((float)iVar17 - (float)iVar5) * 0.33 + (float)iVar5);
            }
          }
          uVar12 = (uint32)uVar14;
          console::info("Compressing to quality level %u",uVar14);
          local_7f0 = 0.0;
          local_484 = uVar12;
          iVar5 = (*p->_vptr_itexture_comp[4])(p,local_7b0,&local_7f0);
          if ((char)iVar5 == '\0') goto LAB_00166f49;
          afStack_438[(int)uVar12] = local_7f0;
          if (local_7ec <= local_7f0) {
            local_7ec = local_7f0;
          }
          console::info("\nTried quality level %u, bpp: %3.3f",SUB84((double)local_7f0,0),uVar14);
          if ((((int)local_7f4 < 0) ||
              ((local_7f0 <= local_488 && (local_488 < (float)local_7e8._0_4_)))) ||
             (((local_7f0 <= local_488 || (local_488 < (float)local_7e8._0_4_)) &&
              (ABS(local_7f0 - local_488) < ABS((float)local_7e8._0_4_ - local_488))))) {
            local_7e8 = ZEXT416((uint)local_7f0);
            iVar5 = (*p->_vptr_itexture_comp[7])(p);
            puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar5);
            puVar4 = local_7b8->m_p;
            local_7b8->m_p = (uchar *)*puVar9;
            *puVar9 = puVar4;
            uVar3 = local_7b8->m_size;
            local_7b8->m_size = *(uint *)(puVar9 + 1);
            *(uint *)(puVar9 + 1) = uVar3;
            uVar3 = local_7b8->m_capacity;
            local_7b8->m_capacity = *(uint *)((long)puVar9 + 0xc);
            *(uint *)((long)puVar9 + 0xc) = uVar3;
            if ((int)local_7d0->m_flags < 0) {
              console::debug("Choose new best quality level");
            }
            local_7f4 = uVar12;
            if (((float)local_7e8._0_4_ <= local_488) &&
               (ABS((float)local_7e8._0_4_ - local_488) < 0.005)) break;
          }
          uVar14 = (ulong)(uVar12 + 1);
          if (local_488 < local_7f0) {
            uVar18 = (ulong)(uVar12 - 1);
            uVar14 = uVar15;
          }
          uVar15 = uVar14;
          uVar19 = uVar19 + 1;
          bVar16 = bVar16 | 8 < uVar19;
        } while ((int)uVar15 <= (int)uVar18);
        if ((((local_790 & 2) == 0) || (local_488 <= local_7ec)) ||
           (ABS((float)local_7e8._0_4_ - local_488) < 0.005)) {
          (**p->_vptr_itexture_comp)(p);
          crnlib_free(p);
          if ((int)local_7f4 < 0) {
            return false;
          }
          if (local_7c0 != (uint32 *)0x0) {
            *local_7c0 = local_7f4;
          }
          if (local_7c8 != (float *)0x0) {
            *local_7c8 = (float)local_7e8._0_4_;
          }
          console::printf("Selected quality level %u bpp: %f",
                          SUB84((double)(float)local_7e8._0_4_,0),(ulong)local_7f4);
          return true;
        }
        console::info(
                     "Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search."
                     );
        local_790 = local_790 & 0xfffffffd;
        (**p->_vptr_itexture_comp)(p);
        crnlib_free(p);
        p = create_texture_comp(local_7ac);
        iVar5 = (*p->_vptr_itexture_comp[3])(p,local_7b0);
      } while ((char)iVar5 != '\0');
      goto LAB_00166f49;
    }
LAB_00166f77:
    console::info("Compressing using quality level %i",(ulong)local_484);
  }
  else if ((local_7ac == cCRNFileTypeCRN) || (local_484 < 0xff && local_7ac == cCRNFileTypeDDS))
  goto LAB_00166f77;
  if (local_798 == 1) {
    if (local_7ac == cCRNFileTypeCRN) {
      p_00 = "CRN format doesn\'t support DXT3";
    }
    else {
      if ((local_7ac != cCRNFileTypeDDS) || (0xfe < local_484)) goto LAB_00166fc1;
      p_00 = "Clustered DDS compressor doesn\'t support DXT3";
    }
    console::warning(p_00);
  }
LAB_00166fc1:
  iVar5 = (*p->_vptr_itexture_comp[4])(p,local_7b0,pActual_bitrate);
  if ((char)iVar5 != '\0') {
    iVar5 = (*p->_vptr_itexture_comp[7])();
    puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
    puVar4 = comp_data->m_p;
    comp_data->m_p = (uchar *)*puVar9;
    *puVar9 = puVar4;
    uVar3 = comp_data->m_size;
    comp_data->m_size = *(uint *)(puVar9 + 1);
    *(uint *)(puVar9 + 1) = uVar3;
    uVar3 = comp_data->m_capacity;
    comp_data->m_capacity = *(uint *)((long)puVar9 + 0xc);
    *(uint *)((long)puVar9 + 0xc) = uVar3;
    if ((pActual_quality_level != (uint32 *)0x0) && (local_488 <= 0.0)) {
      *pActual_quality_level = local_484;
    }
    (**p->_vptr_itexture_comp)(p);
    crnlib_free(p);
    return true;
  }
  (**p->_vptr_itexture_comp)(p);
LAB_00166f52:
  crnlib_free(p);
  return false;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate) {
  crn_comp_params local_params(params);

  if (pixel_format_helpers::is_crn_format_non_srgb(local_params.m_format)) {
    if (local_params.get_flag(cCRNCompFlagPerceptual)) {
      console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");

      // Destination compressed pixel format is swizzled or not RGB at all, so be sure perceptual colorspace metrics are disabled.
      local_params.set_flag(cCRNCompFlagPerceptual, false);
    }
  }

  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  comp_data.resize(0);

  itexture_comp* pTexture_comp = create_texture_comp(local_params.m_file_type);
  if (!pTexture_comp)
    return false;

  if (!pTexture_comp->compress_init(local_params)) {
    crnlib_delete(pTexture_comp);
    return false;
  }

  if ((local_params.m_target_bitrate <= 0.0f) ||
      (local_params.m_format == cCRNFmtDXT3) ||
      ((local_params.m_file_type == cCRNFileTypeCRN) && ((local_params.m_flags & cCRNCompFlagManualPaletteSizes) != 0))) {
    if ((local_params.m_file_type == cCRNFileTypeCRN) ||
        ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))) {
      console::info("Compressing using quality level %i", local_params.m_quality_level);
    }
    if (local_params.m_format == cCRNFmtDXT3) {
      if (local_params.m_file_type == cCRNFileTypeCRN)
        console::warning("CRN format doesn't support DXT3");
      else if ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))
        console::warning("Clustered DDS compressor doesn't support DXT3");
    }
    if (!pTexture_comp->compress_pass(local_params, pActual_bitrate)) {
      crnlib_delete(pTexture_comp);
      return false;
    }

    comp_data.swap(pTexture_comp->get_comp_data());

    if ((pActual_quality_level) && (local_params.m_target_bitrate <= 0.0))
      *pActual_quality_level = local_params.m_quality_level;

    crnlib_delete(pTexture_comp);
    return true;
  }

  // Interpolative search to find closest quality level to target bitrate.
  const int cLowestQuality = 0;
  const int cHighestQuality = cCRNMaxQualityLevel;
  const int cNumQualityLevels = cHighestQuality - cLowestQuality + 1;

  float best_bitrate = 1e+10f;
  int best_quality_level = -1;
  const uint cMaxIterations = 8;

  for (;;) {
    int low_quality = cLowestQuality;
    int high_quality = cHighestQuality;

    float cached_bitrates[cNumQualityLevels];
    for (int i = 0; i < cNumQualityLevels; i++)
      cached_bitrates[i] = -1.0f;

    float highest_bitrate = 0.0f;

    uint iter_count = 0;
    bool force_binary_search = false;

    while (low_quality <= high_quality) {
      if (params.m_flags & cCRNCompFlagDebugging) {
        console::debug("Quality level bracket: [%u, %u]", low_quality, high_quality);
      }

      int trial_quality = (low_quality + high_quality) / 2;

      if ((iter_count) && (!force_binary_search)) {
        int bracket_low = trial_quality;
        while ((cached_bitrates[bracket_low] < 0) && (bracket_low > cLowestQuality))
          bracket_low--;

        if (cached_bitrates[bracket_low] < 0)
          trial_quality = static_cast<int>(math::lerp<float>((float)low_quality, (float)high_quality, .33f));
        else {
          int bracket_high = trial_quality + 1;
          if (bracket_high <= cHighestQuality) {
            while ((cached_bitrates[bracket_high] < 0) && (bracket_high < cHighestQuality))
              bracket_high++;

            if (cached_bitrates[bracket_high] >= 0) {
              float bracket_low_bitrate = cached_bitrates[bracket_low];
              float bracket_high_bitrate = cached_bitrates[bracket_high];

              if ((bracket_low_bitrate < bracket_high_bitrate) &&
                  (bracket_low_bitrate < local_params.m_target_bitrate) &&
                  (bracket_high_bitrate >= local_params.m_target_bitrate)) {
                int quality = low_quality + static_cast<int>(((local_params.m_target_bitrate - bracket_low_bitrate) * (high_quality - low_quality)) / (bracket_high_bitrate - bracket_low_bitrate));

                if ((quality >= low_quality) && (quality <= high_quality)) {
                  trial_quality = quality;
                }
              }
            }
          }
        }
      }

      console::info("Compressing to quality level %u", trial_quality);

      float bitrate = 0.0f;

      local_params.m_quality_level = trial_quality;

      if (!pTexture_comp->compress_pass(local_params, &bitrate)) {
        crnlib_delete(pTexture_comp);
        return false;
      }

      cached_bitrates[trial_quality] = bitrate;

      highest_bitrate = math::maximum(highest_bitrate, bitrate);

      console::info("\nTried quality level %u, bpp: %3.3f", trial_quality, bitrate);

      if ((best_quality_level < 0) ||
          ((bitrate <= local_params.m_target_bitrate) && (best_bitrate > local_params.m_target_bitrate)) ||
          (((bitrate <= local_params.m_target_bitrate) || (best_bitrate > local_params.m_target_bitrate)) && (fabs(bitrate - local_params.m_target_bitrate) < fabs(best_bitrate - local_params.m_target_bitrate)))) {
        best_bitrate = bitrate;
        comp_data.swap(pTexture_comp->get_comp_data());
        best_quality_level = trial_quality;
        if (params.m_flags & cCRNCompFlagDebugging) {
          console::debug("Choose new best quality level");
        }

        if ((best_bitrate <= local_params.m_target_bitrate) && (fabs(best_bitrate - local_params.m_target_bitrate) < .005f))
          break;
      }

      if (bitrate > local_params.m_target_bitrate)
        high_quality = trial_quality - 1;
      else
        low_quality = trial_quality + 1;

      iter_count++;
      if (iter_count > cMaxIterations) {
        force_binary_search = true;
      }
    }

    if (((local_params.m_flags & cCRNCompFlagHierarchical) != 0) &&
        (highest_bitrate < local_params.m_target_bitrate) &&
        (fabs(best_bitrate - local_params.m_target_bitrate) >= .005f)) {
      console::info("Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search.");

      local_params.m_flags &= ~cCRNCompFlagHierarchical;

      crnlib_delete(pTexture_comp);
      pTexture_comp = create_texture_comp(local_params.m_file_type);

      if (!pTexture_comp->compress_init(local_params)) {
        crnlib_delete(pTexture_comp);
        return false;
      }
    } else
      break;
  }

  crnlib_delete(pTexture_comp);
  pTexture_comp = NULL;

  if (best_quality_level < 0)
    return false;

  if (pActual_quality_level)
    *pActual_quality_level = best_quality_level;
  if (pActual_bitrate)
    *pActual_bitrate = best_bitrate;

  console::printf("Selected quality level %u bpp: %f", best_quality_level, best_bitrate);

  return true;
}